

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

char * cmsys::reg(int paren,int *flagp)

{
  char *val;
  char *val_00;
  uint uVar1;
  char *pcVar2;
  char cVar3;
  int flags;
  uint local_2c;
  
  *flagp = 1;
  if (paren == 0) {
    cVar3 = '\0';
    pcVar2 = (char *)0x0;
  }
  else {
    if (9 < regnpar) {
      pcVar2 = "RegularExpression::compile(): Too many parentheses.";
      goto LAB_00441e4c;
    }
    cVar3 = (char)regnpar;
    regnpar = regnpar + 1;
    pcVar2 = regnode(cVar3 + '\x14');
    cVar3 = cVar3 + '\x1e';
  }
  val = regbranch((int *)&local_2c);
  if (val == (char *)0x0) {
    return (char *)0x0;
  }
  if (pcVar2 != (char *)0x0) {
    regtail(pcVar2,val);
    val = pcVar2;
  }
  uVar1 = *flagp & 0xfffffffe;
  if ((local_2c & 1) != 0) {
    uVar1 = *flagp;
  }
  while (*flagp = local_2c & 4 | uVar1, *regparse == '|') {
    regparse = regparse + 1;
    pcVar2 = regbranch((int *)&local_2c);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    regtail(val,pcVar2);
    uVar1 = *flagp;
    if ((local_2c & 1) == 0) {
      uVar1 = uVar1 & 0xfffffffe;
      *flagp = uVar1;
    }
  }
  val_00 = regnode(cVar3);
  regtail(val,val_00);
  for (pcVar2 = val; pcVar2 != (char *)0x0; pcVar2 = regnext(pcVar2)) {
    regoptail(pcVar2,val_00);
  }
  if (paren == 0) {
    if (*regparse == '\0') {
      return val;
    }
    if (*regparse != ')') {
      pcVar2 = "RegularExpression::compile(): Internal error.";
      goto LAB_00441e4c;
    }
  }
  else {
    pcVar2 = regparse + 1;
    cVar3 = *regparse;
    regparse = pcVar2;
    if (cVar3 == ')') {
      return val;
    }
  }
  pcVar2 = "RegularExpression::compile(): Unmatched parentheses.";
LAB_00441e4c:
  puts(pcVar2);
  return (char *)0x0;
}

Assistant:

static char* reg(int paren, int* flagp)
{
  char* ret;
  char* br;
  char* ender;
  int parno = 0;
  int flags;

  *flagp = HASWIDTH; // Tentatively.

  // Make an OPEN node, if parenthesized.
  if (paren) {
    if (regnpar >= RegularExpression::NSUBEXP) {
      // RAISE Error, SYM(RegularExpression), SYM(Too_Many_Parens),
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return 0;
    }
    parno = regnpar;
    regnpar++;
    ret = regnode(static_cast<char>(OPEN + parno));
  } else
    ret = 0;

  // Pick up the branches, linking them together.
  br = regbranch(&flags);
  if (br == 0)
    return (0);
  if (ret != 0)
    regtail(ret, br); // OPEN -> first.
  else
    ret = br;
  if (!(flags & HASWIDTH))
    *flagp &= ~HASWIDTH;
  *flagp |= flags & SPSTART;
  while (*regparse == '|') {
    regparse++;
    br = regbranch(&flags);
    if (br == 0)
      return (0);
    regtail(ret, br); // BRANCH -> BRANCH.
    if (!(flags & HASWIDTH))
      *flagp &= ~HASWIDTH;
    *flagp |= flags & SPSTART;
  }

  // Make a closing node, and hook it on the end.
  ender = regnode(static_cast<char>((paren) ? CLOSE + parno : END));
  regtail(ret, ender);

  // Hook the tails of the branches to the closing node.
  for (br = ret; br != 0; br = regnext(br))
    regoptail(br, ender);

  // Check for proper termination.
  if (paren && *regparse++ != ')') {
    // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
    printf("RegularExpression::compile(): Unmatched parentheses.\n");
    return 0;
  } else if (!paren && *regparse != '\0') {
    if (*regparse == ')') {
      // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      return 0;
    } else {
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n");
      return 0;
    }
    // NOTREACHED
  }
  return (ret);
}